

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

int lws_tls_server_conn_alpn(lws *wsi)

{
  uint local_30;
  char local_2a [2];
  uint len;
  char cstr [10];
  uchar *name;
  lws *wsi_local;
  
  cstr[2] = '\0';
  cstr[3] = '\0';
  cstr[4] = '\0';
  cstr[5] = '\0';
  cstr[6] = '\0';
  cstr[7] = '\0';
  cstr[8] = '\0';
  cstr[9] = '\0';
  if ((wsi->tls).ssl == (lws_tls_conn *)0x0) {
    wsi_local._4_4_ = 0;
  }
  else {
    SSL_get0_alpn_selected((wsi->tls).ssl,cstr + 2,&local_30);
    if (local_30 == 0) {
      _lws_log(8,"no ALPN upgrade\n");
      wsi_local._4_4_ = 0;
    }
    else {
      if (9 < local_30) {
        local_30 = 9;
      }
      memcpy(local_2a,(void *)cstr._2_8_,(ulong)local_30);
      local_2a[local_30] = '\0';
      _lws_log(8,"negotiated \'%s\' using ALPN\n",local_2a);
      (wsi->tls).use_ssl = (wsi->tls).use_ssl | 1;
      wsi_local._4_4_ = lws_role_call_alpn_negotiated(wsi,local_2a);
    }
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_tls_server_conn_alpn(struct lws *wsi)
{
#if defined(LWS_WITH_MBEDTLS) || (defined(OPENSSL_VERSION_NUMBER) && \
				  OPENSSL_VERSION_NUMBER >= 0x10002000L)
	const unsigned char *name = NULL;
	char cstr[10];
	unsigned len;

	if (!wsi->tls.ssl)
		return 0;

	SSL_get0_alpn_selected(wsi->tls.ssl, &name, &len);
	if (!len) {
		lwsl_info("no ALPN upgrade\n");
		return 0;
	}

	if (len > sizeof(cstr) - 1)
		len = sizeof(cstr) - 1;

	memcpy(cstr, name, len);
	cstr[len] = '\0';

	lwsl_info("negotiated '%s' using ALPN\n", cstr);
	wsi->tls.use_ssl |= LCCSCF_USE_SSL;

	return lws_role_call_alpn_negotiated(wsi, (const char *)cstr);
#endif // OPENSSL_VERSION_NUMBER >= 0x10002000L

	return 0;
}